

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O0

float ncnn::bilinear_interpolate(float *ptr,int w,int h,float x,float y)

{
  int iVar1;
  int iVar2;
  float v;
  float r1;
  float r0;
  float b1;
  float b0;
  float a1;
  float a0;
  int y1;
  int y0;
  int x1;
  int x0;
  float y_local;
  float x_local;
  int h_local;
  int w_local;
  float *ptr_local;
  
  iVar1 = (int)x;
  x1 = iVar1 + 1;
  iVar2 = (int)y;
  y1 = iVar2 + 1;
  a0 = (float)x1 - x;
  a1 = x - (float)iVar1;
  b0 = (float)y1 - y;
  b1 = y - (float)iVar2;
  if (w <= x1) {
    x1 = w + -1;
    a0 = 1.0;
    a1 = 0.0;
  }
  if (h <= y1) {
    y1 = h + -1;
    b0 = 1.0;
    b1 = 0.0;
  }
  return (ptr[iVar2 * w + iVar1] * a0 + ptr[iVar2 * w + x1] * a1) * b0 +
         (ptr[y1 * w + iVar1] * a0 + ptr[y1 * w + x1] * a1) * b1;
}

Assistant:

static inline float bilinear_interpolate(const float* ptr, int w, int h, float x, float y)
{
    int x0 = (int)x;
    int x1 = x0 + 1;
    int y0 = (int)y;
    int y1 = y0 + 1;

    float a0 = x1 - x;
    float a1 = x - x0;
    float b0 = y1 - y;
    float b1 = y - y0;

    if (x1 >= w)
    {
        x1 = w - 1;
        a0 = 1.f;
        a1 = 0.f;
    }
    if (y1 >= h)
    {
        y1 = h - 1;
        b0 = 1.f;
        b1 = 0.f;
    }

    float r0 = ptr[y0 * w + x0] * a0 + ptr[y0 * w + x1] * a1;
    float r1 = ptr[y1 * w + x0] * a0 + ptr[y1 * w + x1] * a1;

    float v = r0 * b0 + r1 * b1;

    return v;
}